

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QCborSimpleType st)

{
  long lVar1;
  char *pcVar2;
  QDebug *pQVar3;
  QCborSimpleType in_DL;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  char *id;
  QDebugStateSaver saver;
  uint in_stack_ffffffffffffff6c;
  QDebugStateSaver *in_stack_ffffffffffffff70;
  QDebug *in_stack_ffffffffffffff88;
  QDebugStateSaver *in_stack_ffffffffffffff90;
  QDebug *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDebugStateSaver::QDebugStateSaver(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pcVar2 = qt_cbor_simpletype_id(in_DL);
  if (pcVar2 == (char *)0x0) {
    QDebug::nospace(in_RSI);
    QDebug::operator<<(in_stack_ffffffffffffff98,in_stack_ffffffffffffffc8);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    in_stack_ffffffffffffff70 =
         (QDebugStateSaver *)
         QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,
                            (char)(in_stack_ffffffffffffff6c >> 0x18));
    QDebug::QDebug((QDebug *)in_RDI,(QDebug *)in_stack_ffffffffffffff70);
  }
  else {
    QDebug::nospace(in_RSI);
    pQVar3 = QDebug::operator<<(in_stack_ffffffffffffff98,in_stack_ffffffffffffffc8);
    pQVar3 = QDebug::operator<<(pQVar3,in_stack_ffffffffffffffc8);
    QDebug::QDebug((QDebug *)in_RDI,pQVar3);
  }
  QDebugStateSaver::~QDebugStateSaver(in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, QCborSimpleType st)
{
    QDebugStateSaver saver(dbg);
    const char *id = qt_cbor_simpletype_id(st);
    if (id)
        return dbg.nospace() << "QCborSimpleType::" << id;

    return dbg.nospace() << "QCborSimpleType(" << uint(st) << ')';
}